

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::synchronization_internal::anon_unknown_0::NodeSet::insert
          (NodeSet *this,int32_t v)

{
  int *piVar1;
  int iVar2;
  uint n;
  int *piVar3;
  uint32_t uVar4;
  ulong uVar5;
  long lVar6;
  Vec<int> copy;
  int local_64;
  Vec<int> local_60;
  
  uVar4 = FindIndex(this,v);
  piVar3 = (this->table_).ptr_;
  iVar2 = piVar3[uVar4];
  if (iVar2 != v) {
    if (iVar2 == -1) {
      this->occupied_ = this->occupied_ + 1;
    }
    piVar3[uVar4] = v;
    n = (this->table_).size_;
    if (n - (n >> 2) <= this->occupied_) {
      local_60.ptr_ = local_60.space_;
      local_60.size_ = 0;
      local_60.capacity_ = 8;
      piVar1 = (this->table_).space_;
      if (piVar3 == piVar1) {
        Vec<int>::resize(&local_60,n);
        uVar5 = (ulong)(this->table_).size_;
        if (uVar5 != 0) {
          memmove(local_60.ptr_,(this->table_).ptr_,uVar5 << 2);
        }
        (this->table_).size_ = 0;
        uVar5 = local_60._40_8_ & 0xffffffff;
      }
      else {
        Vec<int>::Discard(&local_60);
        local_60.ptr_ = (this->table_).ptr_;
        uVar5._0_4_ = (this->table_).size_;
        uVar5._4_4_ = (this->table_).capacity_;
        (this->table_).ptr_ = piVar1;
        (this->table_).size_ = 0;
        (this->table_).capacity_ = 8;
        local_60._40_8_ = uVar5;
      }
      this->occupied_ = 0;
      Vec<int>::resize(&this->table_,(int)uVar5 * 2);
      local_64 = -1;
      Vec<int>::fill(&this->table_,&local_64);
      piVar3 = local_60.ptr_;
      uVar5 = local_60._40_8_ & 0xffffffff;
      for (lVar6 = 0; uVar5 << 2 != lVar6; lVar6 = lVar6 + 4) {
        if (-1 < *(int32_t *)((long)piVar3 + lVar6)) {
          insert(this,*(int32_t *)((long)piVar3 + lVar6));
        }
      }
      Vec<int>::~Vec(&local_60);
    }
  }
  return iVar2 != v;
}

Assistant:

bool insert(int32_t v) {
    uint32_t i = FindIndex(v);
    if (table_[i] == v) {
      return false;
    }
    if (table_[i] == kEmpty) {
      // Only inserting over an empty cell increases the number of occupied
      // slots.
      occupied_++;
    }
    table_[i] = v;
    // Double when 75% full.
    if (occupied_ >= table_.size() - table_.size()/4) Grow();
    return true;
  }